

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_from_data(void)

{
  byte bVar1;
  int iVar2;
  bson_iter_t iter;
  uint8_t data [9];
  undefined1 auStack_100 [103];
  undefined8 local_99;
  undefined1 local_91;
  
  local_99 = 0x100620800000009;
  local_91 = 0;
  bVar1 = bson_iter_init_from_data(auStack_100,&local_99,9);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x25c,"test_bson_iter_from_data","bson_iter_init_from_data (&iter, data, sizeof data)");
    abort();
  }
  bVar1 = bson_iter_next(auStack_100);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x25d,"test_bson_iter_from_data","bson_iter_next (&iter)");
    abort();
  }
  iVar2 = bson_iter_type(auStack_100);
  if (iVar2 != 8) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x25e,"test_bson_iter_from_data","BSON_ITER_HOLDS_BOOL (&iter)");
    abort();
  }
  bVar1 = bson_iter_bool(auStack_100);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x25f,"test_bson_iter_from_data","bson_iter_bool (&iter)");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_iter_from_data (void)
{
   /* {"b": true}, with implicit NULL at end */
   uint8_t data[] = "\x09\x00\x00\x00\x08\x62\x00\x01";
   bson_iter_t iter;

   ASSERT (bson_iter_init_from_data (&iter, data, sizeof data));
   ASSERT (bson_iter_next (&iter));
   ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   ASSERT (bson_iter_bool (&iter));
}